

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_simplify_numpow_xk(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  TRef TVar3;
  TRef TVar4;
  cTValue *pcVar5;
  IRRef1 IVar6;
  IRRef2 IVar7;
  ulong uVar8;
  
  IVar7 = (J->fold).right.field_1.op12;
  uVar1 = (J->fold).ins.field_0.op1;
  TVar4 = (TRef)uVar1;
  TVar3 = TVar4;
  if (IVar7 != 1) {
    if (IVar7 == 0) {
      pcVar5 = lj_ir_k64_find(J,0x3ff0000000000000);
      TVar3 = lj_ir_k64(J,IR_KNUM,pcVar5);
      return TVar3;
    }
    TVar3 = 0;
    if (0xfffdfffe < IVar7 - 0x10001) {
      if ((int)IVar7 < 0) {
        pcVar5 = lj_ir_k64_find(J,0x3ff0000000000000);
        TVar3 = lj_ir_k64(J,IR_KNUM,pcVar5);
        (J->fold).ins.field_0.ot = 0x2b0e;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
        (J->fold).ins.field_0.op2 = uVar1;
        TVar4 = lj_opt_fold(J);
        IVar7 = -IVar7;
      }
      if ((IVar7 & 1) == 0) {
        uVar8 = (ulong)IVar7;
        do {
          (J->fold).ins.field_0.ot = 0x2a0e;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
          TVar4 = lj_opt_fold(J);
          uVar8 = uVar8 >> 1;
          uVar2 = IVar7 & 2;
          IVar7 = (IRRef2)uVar8;
        } while (uVar2 == 0);
      }
      else {
        uVar8 = (ulong)IVar7;
      }
      TVar3 = TVar4;
      if (1 < (uint)uVar8) {
        (J->fold).ins.field_0.ot = 0x2a0e;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
        while( true ) {
          TVar3 = lj_opt_fold(J);
          IVar6 = (IRRef1)TVar3;
          if ((int)(uVar8 >> 1) == 1) break;
          if ((uVar8 & 2) != 0) {
            (J->fold).ins.field_0.ot = 0x2a0e;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
            (J->fold).ins.field_0.op2 = IVar6;
            TVar4 = lj_opt_fold(J);
          }
          (J->fold).ins.field_0.ot = 0x2a0e;
          (J->fold).ins.field_0.op1 = IVar6;
          (J->fold).ins.field_0.op2 = IVar6;
          uVar8 = uVar8 >> 1;
        }
        (J->fold).ins.field_0.ot = 0x2a0e;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = IVar6;
        TVar3 = lj_opt_fold(J);
        return TVar3;
      }
    }
  }
  return TVar3;
}

Assistant:

LJFOLD(POW any KINT)
LJFOLDF(simplify_numpow_xk)
{
  int32_t k = fright->i;
  TRef ref = fins->op1;
  if (k == 0)  /* x ^ 0 ==> 1 */
    return lj_ir_knum_one(J);  /* Result must be a number, not an int. */
  if (k == 1)  /* x ^ 1 ==> x */
    return LEFTFOLD;
  if ((uint32_t)(k+65536) > 2*65536u)  /* Limit code explosion. */
    return NEXTFOLD;
  if (k < 0) {  /* x ^ (-k) ==> (1/x) ^ k. */
    ref = emitir(IRTN(IR_DIV), lj_ir_knum_one(J), ref);
    k = -k;
  }
  /* Unroll x^k for 1 <= k <= 65536. */
  for (; (k & 1) == 0; k >>= 1)  /* Handle leading zeros. */
    ref = emitir(IRTN(IR_MUL), ref, ref);
  if ((k >>= 1) != 0) {  /* Handle trailing bits. */
    TRef tmp = emitir(IRTN(IR_MUL), ref, ref);
    for (; k != 1; k >>= 1) {
      if (k & 1)
	ref = emitir(IRTN(IR_MUL), ref, tmp);
      tmp = emitir(IRTN(IR_MUL), tmp, tmp);
    }
    ref = emitir(IRTN(IR_MUL), ref, tmp);
  }
  return ref;
}